

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O2

bool __thiscall
sf::priv::RenderTextureImplFBO::create
          (RenderTextureImplFBO *this,uint width,uint height,uint textureId,
          ContextSettings *settings)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  Uint64 UVar4;
  GLenum GVar5;
  TransientContextLock lock;
  GLint readFramebuffer;
  GLint drawFramebuffer;
  
  this->m_width = width;
  this->m_height = height;
  GlResource::TransientContextLock::TransientContextLock(&lock);
  ensureExtensionsInit();
  uVar1 = settings->antialiasingLevel;
  if (((uVar1 == 0) ||
      ((SF_GLAD_GL_EXT_framebuffer_multisample != 0 && (SF_GLAD_GL_EXT_framebuffer_blit != 0)))) &&
     ((settings->stencilBits == 0 || (SF_GLAD_GL_EXT_packed_depth_stencil != 0)))) {
    this->m_sRgb = settings->sRgbCapable;
    if (uVar1 == 0) {
LAB_001ae812:
      if (settings->stencilBits == 0) {
        if (settings->depthBits != 0) {
          readFramebuffer = 0;
          (*sf_glad_glGenRenderbuffersEXT)(1,(GLuint *)&readFramebuffer);
          this->m_depthStencilBuffer = readFramebuffer;
          if (readFramebuffer == 0) {
            poVar3 = err();
            poVar3 = std::operator<<(poVar3,
                                     "Impossible to create render texture (failed to create the attached depth buffer)"
                                    );
            std::endl<char,std::char_traits<char>>(poVar3);
            goto LAB_001aea38;
          }
          (*sf_glad_glBindRenderbufferEXT)(0x8d41);
          (*sf_glad_glRenderbufferStorageEXT)(0x8d41,0x1902,width,height);
        }
      }
      else {
        readFramebuffer = 0;
        (*sf_glad_glGenRenderbuffersEXT)(1,(GLuint *)&readFramebuffer);
        this->m_depthStencilBuffer = readFramebuffer;
        if (readFramebuffer == 0) {
          poVar3 = err();
          poVar3 = std::operator<<(poVar3,
                                   "Impossible to create render texture (failed to create the attached depth/stencil buffer)"
                                  );
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_001aea38;
        }
        (*sf_glad_glBindRenderbufferEXT)(0x8d41);
        (*sf_glad_glRenderbufferStorageEXT)(0x8d41,0x88f0,width,height);
        this->m_stencil = true;
      }
    }
    else {
      readFramebuffer = 0;
      (*sf_glad_glGetIntegerv)(0x8d57,&readFramebuffer);
      if ((uint)readFramebuffer < settings->antialiasingLevel) {
        poVar3 = err();
        std::operator<<(poVar3,
                        "Impossible to create render texture (unsupported anti-aliasing level)");
        poVar3 = err();
        poVar3 = std::operator<<(poVar3," Requested: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3," Maximum supported: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,readFramebuffer);
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_001aea38;
      }
      if (settings->antialiasingLevel == 0) goto LAB_001ae812;
      readFramebuffer = 0;
      (*sf_glad_glGenRenderbuffersEXT)(1);
      this->m_colorBuffer = readFramebuffer;
      if (readFramebuffer == 0) {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "Impossible to create render texture (failed to create the attached multisample color buffer)"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_001aea38;
      }
      (*sf_glad_glBindRenderbufferEXT)(0x8d41);
      GVar5 = 0x1908;
      if (this->m_sRgb != false) {
        GVar5 = 0x8c43;
      }
      (*sf_glad_glRenderbufferStorageMultisampleEXT)
                (0x8d41,settings->antialiasingLevel,GVar5,width,height);
      if (settings->stencilBits == 0) {
        if (settings->depthBits != 0) {
          drawFramebuffer = 0;
          (*sf_glad_glGenRenderbuffersEXT)(1);
          this->m_depthStencilBuffer = drawFramebuffer;
          if (drawFramebuffer == 0) {
            poVar3 = err();
            poVar3 = std::operator<<(poVar3,
                                     "Impossible to create render texture (failed to create the attached multisample depth buffer)"
                                    );
            std::endl<char,std::char_traits<char>>(poVar3);
            goto LAB_001aea38;
          }
          (*sf_glad_glBindRenderbufferEXT)(0x8d41);
          (*sf_glad_glRenderbufferStorageMultisampleEXT)
                    (0x8d41,settings->antialiasingLevel,0x1902,width,height);
        }
      }
      else {
        drawFramebuffer = 0;
        (*sf_glad_glGenRenderbuffersEXT)(1);
        this->m_depthStencilBuffer = drawFramebuffer;
        if (drawFramebuffer == 0) {
          poVar3 = err();
          poVar3 = std::operator<<(poVar3,
                                   "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)"
                                  );
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_001aea38;
        }
        (*sf_glad_glBindRenderbufferEXT)(0x8d41);
        (*sf_glad_glRenderbufferStorageMultisampleEXT)
                  (0x8d41,settings->antialiasingLevel,0x88f0,width,height);
        this->m_stencil = true;
      }
      this->m_multisample = true;
    }
    GlResource::TransientContextLock::~TransientContextLock(&lock);
    this->m_textureId = textureId;
    UVar4 = Context::getActiveContextId();
    if (UVar4 == 0) {
      bVar2 = true;
    }
    else {
      readFramebuffer = 0;
      drawFramebuffer = 0;
      (*sf_glad_glGetIntegerv)(0x8caa,&readFramebuffer);
      (*sf_glad_glGetIntegerv)(0x8ca6,&drawFramebuffer);
      bVar2 = createFrameBuffer(this);
      if (bVar2) {
        (*sf_glad_glBindFramebufferEXT)(0x8ca8,readFramebuffer);
        (*sf_glad_glBindFramebufferEXT)(0x8ca9,drawFramebuffer);
      }
    }
  }
  else {
LAB_001aea38:
    GlResource::TransientContextLock::~TransientContextLock(&lock);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RenderTextureImplFBO::create(unsigned int width, unsigned int height, unsigned int textureId, const ContextSettings& settings)
{
    // Store the dimensions
    m_width = width;
    m_height = height;

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();

        if (settings.antialiasingLevel && !(GLEXT_framebuffer_multisample && GLEXT_framebuffer_blit))
            return false;

        if (settings.stencilBits && !GLEXT_packed_depth_stencil)
            return false;

        m_sRgb = settings.sRgbCapable && GL_EXT_texture_sRGB;

#ifndef SFML_OPENGL_ES

        // Check if the requested anti-aliasing level is supported
        if (settings.antialiasingLevel)
        {
            GLint samples = 0;
            glCheck(glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples));

            if (settings.antialiasingLevel > static_cast<unsigned int>(samples))
            {
                err() << "Impossible to create render texture (unsupported anti-aliasing level)";
                err() << " Requested: " << settings.antialiasingLevel << " Maximum supported: " << samples << std::endl;
                return false;
            }
        }

#endif


        if (!settings.antialiasingLevel)
        {
            // Create the depth/stencil buffer if requested
            if (settings.stencilBits)
            {

#ifndef SFML_OPENGL_ES

                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH24_STENCIL8, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

#else

                err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                return false;

#endif // SFML_OPENGL_ES

                m_stencil = true;

            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH_COMPONENT, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));
            }
        }
        else
        {

#ifndef SFML_OPENGL_ES

            // Create the multisample color buffer
            GLuint color = 0;
            glCheck(GLEXT_glGenRenderbuffers(1, &color));
            m_colorBuffer = color;
            if (!m_colorBuffer)
            {
                err() << "Impossible to create render texture (failed to create the attached multisample color buffer)" << std::endl;
                return false;
            }
            glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer));
            glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), m_sRgb ? GL_SRGB8_ALPHA8_EXT : GL_RGBA, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

            // Create the multisample depth/stencil buffer if requested
            if (settings.stencilBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), GLEXT_GL_DEPTH24_STENCIL8, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

                m_stencil = true;
            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), GLEXT_GL_DEPTH_COMPONENT, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));
            }

#else

            err() << "Impossible to create render texture (failed to create the multisample render buffers)" << std::endl;
            return false;

#endif // SFML_OPENGL_ES

            m_multisample = true;

        }
    }

    // Save our texture ID in order to be able to attach it to an FBO at any time
    m_textureId = textureId;

    // We can't create an FBO now if there is no active context
    if (!Context::getActiveContextId())
        return true;

#ifndef SFML_OPENGL_ES

    // Save the current bindings so we can restore them after we are done
    GLint readFramebuffer = 0;
    GLint drawFramebuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
    glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, static_cast<GLuint>(readFramebuffer)));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, static_cast<GLuint>(drawFramebuffer)));

        return true;
    }

#else

    // Save the current binding so we can restore them after we are done
    GLint frameBuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &frameBuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, static_cast<GLuint>(frameBuffer)));

        return true;
    }

#endif

    return false;
}